

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int tga_test(stbi *s)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  stbi *in_RDI;
  int sz;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  get8u((stbi *)0x109133);
  bVar1 = get8u((stbi *)0x10913d);
  if (bVar1 < 2) {
    bVar1 = get8u((stbi *)0x109162);
    uVar2 = (uint)bVar1;
    if (((((uVar2 == 1) || (uVar2 == 2)) || (uVar2 == 3)) || ((uVar2 == 9 || (uVar2 == 10)))) ||
       (uVar2 == 0xb)) {
      get16(in_RDI);
      get16(in_RDI);
      get8((stbi *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
      get16(in_RDI);
      get16(in_RDI);
      iVar3 = get16(in_RDI);
      if (iVar3 < 1) {
        local_4 = 0;
      }
      else {
        iVar3 = get16(in_RDI);
        if (iVar3 < 1) {
          local_4 = 0;
        }
        else {
          iVar3 = get8((stbi *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
          if (((iVar3 == 8) || (iVar3 == 0x10)) || ((iVar3 == 0x18 || (iVar3 == 0x20)))) {
            local_4 = 1;
          }
          else {
            local_4 = 0;
          }
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int tga_test(stbi *s)
{
	int sz;
	get8u(s);		//	discard Offset
	sz = get8u(s);	//	color type
	if( sz > 1 ) return 0;	//	only RGB or indexed allowed
	sz = get8u(s);	//	image type
	if( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;	//	only RGB or grey allowed, +/- RLE
	get16(s);		//	discard palette start
	get16(s);		//	discard palette length
	get8(s);			//	discard bits per palette color entry
	get16(s);		//	discard x origin
	get16(s);		//	discard y origin
	if( get16(s) < 1 ) return 0;		//	test width
	if( get16(s) < 1 ) return 0;		//	test height
	sz = get8(s);	//	bits per pixel
	if( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) ) return 0;	//	only RGB or RGBA or grey allowed
	return 1;		//	seems to have passed everything
}